

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

string * __thiscall
duckdb::PhysicalCopyToFile::GetTrimmedPath_abi_cxx11_
          (string *__return_storage_ptr__,PhysicalCopyToFile *this,ClientContext *context)

{
  FileSystem *pFVar1;
  string sStack_38;
  
  pFVar1 = FileSystem::GetFileSystem(context);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->file_path);
  (*pFVar1->_vptr_FileSystem[0x18])(&sStack_38,pFVar1,__return_storage_ptr__);
  StringUtil::RTrim((string *)__return_storage_ptr__,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string PhysicalCopyToFile::GetTrimmedPath(ClientContext &context) const {
	auto &fs = FileSystem::GetFileSystem(context);
	string trimmed_path = file_path;
	StringUtil::RTrim(trimmed_path, fs.PathSeparator(trimmed_path));
	return trimmed_path;
}